

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::peer_list::erase_peers
          (peer_list *this,torrent_state *state,erase_peer_flags_t flags)

{
  int iVar1;
  _Map_pointer ppptVar2;
  _Map_pointer ppptVar3;
  torrent_peer **pptVar4;
  torrent_peer *pe;
  int iVar5;
  bool bVar6;
  _Elt_pointer pptVar7;
  ulong uVar8;
  long lVar9;
  torrent_peer **pptVar10;
  _Elt_pointer pptVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  iterator *i;
  uint uVar19;
  long lVar20;
  torrent_peer **pptVar21;
  uint local_d8;
  iterator local_90;
  iterator local_70;
  iterator local_50;
  
  iVar1 = state->max_peerlist_size;
  if (iVar1 == 0) {
    return;
  }
  pptVar11 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar7 = (this->m_peers).
            super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            .
            super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar7 == pptVar11) {
    return;
  }
  if (*(uint *)&this->field_0x60 >> 0x1f != (uint)state->is_finished) {
    recalculate_connect_candidates(this,state);
    pptVar11 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar7 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  }
  ppptVar2 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar8 = random((aux *)(ulong)(((int)((ulong)((long)(this->m_peers).
                                                                                                          
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                                              (long)pptVar11) >> 3) +
                                (int)((ulong)((long)pptVar7 -
                                             (long)(this->m_peers).
                                                                                                      
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_finish._M_first
                                             ) >> 3) +
                                ((((uint)((int)ppptVar2 -
                                         *(int *)&(this->m_peers).
                                                  super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  .
                                                  super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node)
                                  >> 3) - 1) + (uint)(ppptVar2 == (_Map_pointer)0x0)) * 0x40) - 1));
  iVar5 = (iVar1 * 0x5f) / 100;
  ppptVar2 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar18 = (int)((ulong)((long)(this->m_peers).
                               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               .
                               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) +
           (int)((ulong)((long)(this->m_peers).
                               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               .
                               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->m_peers).
                              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              .
                              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
           ((((uint)((int)ppptVar2 -
                    *(int *)&(this->m_peers).
                             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             .
                             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (uint)(ppptVar2 == (_Map_pointer)0x0)) * 0x40;
  if ((int)uVar18 < 1) {
    return;
  }
  uVar19 = 300;
  if (uVar18 < 300) {
    uVar19 = uVar18;
  }
  iVar16 = uVar19 + 1;
  local_d8 = 0xffffffff;
  uVar18 = 0xffffffff;
  do {
    ppptVar2 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppptVar3 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pptVar11 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar21 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    uVar12 = (int)((ulong)((long)pptVar21 - (long)pptVar11) >> 3) +
             (int)((ulong)((long)(this->m_peers).
                                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 .
                                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                          (long)(this->m_peers).
                                super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                .
                                super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
             ((((uint)((int)ppptVar2 - (int)ppptVar3) >> 3) - 1) +
             (uint)(ppptVar2 == (_Map_pointer)0x0)) * 0x40;
    uVar19 = uVar18;
    if ((int)uVar12 < (int)(iVar5 - (uint)(iVar5 == iVar1))) break;
    uVar14 = 0;
    if ((uint)uVar8 != uVar12) {
      uVar14 = (uint)uVar8;
    }
    lVar9 = (long)(int)uVar14;
    pptVar4 = (this->m_peers).
              super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              .
              super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first;
    lVar20 = (long)pptVar11 - (long)pptVar4 >> 3;
    uVar17 = lVar20 + lVar9;
    uVar15 = (long)uVar17 >> 6;
    uVar8 = uVar15;
    if ((long)uVar17 < 0) {
LAB_002805b9:
      pptVar10 = ppptVar3[uVar8] + uVar17 + uVar8 * -0x40;
    }
    else {
      if (0x3f < uVar17) {
        uVar8 = uVar17 >> 6;
        goto LAB_002805b9;
      }
      pptVar10 = pptVar11 + lVar9;
    }
    pe = *pptVar10;
    bVar6 = is_erase_candidate(this,pe);
    if (bVar6) {
      if (uVar18 == 0xffffffff) {
        uVar12 = *(uint *)&pe->field_0x1b;
      }
      else {
        uVar8 = lVar20 + (int)uVar18;
        if ((long)uVar8 < 0) {
          uVar13 = (long)uVar8 >> 6;
LAB_0028062a:
          pptVar10 = ppptVar3[uVar13] + uVar8 + uVar13 * -0x40;
        }
        else {
          if (0x3f < uVar8) {
            uVar13 = uVar8 >> 6;
            goto LAB_0028062a;
          }
          pptVar10 = pptVar11 + (int)uVar18;
        }
        uVar12 = *(uint *)&pe->field_0x1b;
        bVar6 = anon_unknown.dwarf_a06da9::compare_peer_erase
                          ((torrent_peer *)(ulong)*(uint *)&(*pptVar10)->field_0x1b,
                           (torrent_peer *)(ulong)uVar12);
        if (bVar6) goto LAB_002806da;
      }
      uVar19 = uVar14;
      if ((this->m_locked_peer == pe) || ((uVar12 & 0x7e0000) != 0x200000)) goto LAB_002806da;
      if ((long)uVar17 < 0) {
LAB_0028078f:
        local_90._M_node = ppptVar3 + uVar15;
        local_90._M_first = *local_90._M_node;
        local_90._M_last = local_90._M_first + 0x40;
        local_90._M_cur = local_90._M_first + uVar17 + uVar15 * -0x40;
      }
      else {
        if (0x3f < uVar17) {
          uVar15 = uVar17 >> 6;
          goto LAB_0028078f;
        }
        local_90._M_cur = pptVar11 + lVar9;
        local_90._M_first = pptVar4;
        local_90._M_last = pptVar21;
        local_90._M_node = ppptVar3;
      }
      uVar19 = uVar18 - ((int)uVar14 < (int)uVar18);
      local_d8 = local_d8 - ((int)uVar14 < (int)local_d8);
      erase_peer(this,&local_90,state);
    }
    else {
LAB_002806da:
      if ((this->m_locked_peer != pe) && (pe->connection == (peer_connection_interface *)0x0)) {
        if (local_d8 != 0xffffffff) {
          uVar8 = lVar20 + (int)local_d8;
          if ((long)uVar8 < 0) {
            uVar15 = (long)uVar8 >> 6;
LAB_00280725:
            pptVar21 = ppptVar3[uVar15] + uVar8 + uVar15 * -0x40;
          }
          else {
            if (0x3f < uVar8) {
              uVar15 = uVar8 >> 6;
              goto LAB_00280725;
            }
            pptVar21 = pptVar11 + (int)local_d8;
          }
          bVar6 = anon_unknown.dwarf_a06da9::compare_peer_erase
                            ((torrent_peer *)(ulong)*(uint *)&(*pptVar21)->field_0x1b,
                             (torrent_peer *)(ulong)*(uint *)&pe->field_0x1b);
          if (bVar6) goto LAB_0028075d;
        }
        local_d8 = uVar14;
      }
LAB_0028075d:
      uVar14 = uVar14 + 1;
    }
    iVar16 = iVar16 + -1;
    uVar8 = (ulong)uVar14;
    uVar18 = uVar19;
  } while (1 < iVar16);
  if ((int)uVar19 < 0) {
    if ((flags.m_val & 2) == 0) {
      return;
    }
    if ((int)local_d8 < 0) {
      return;
    }
    pptVar11 = (this->m_peers).
               super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               .
               super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_70._M_first =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_70._M_last =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_70._M_node =
         (this->m_peers).
         super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         .
         super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar8 = ((long)pptVar11 - (long)local_70._M_first >> 3) + (ulong)local_d8;
    if ((long)uVar8 < 0) {
      uVar15 = (long)uVar8 >> 6;
LAB_002808ee:
      local_70._M_node = local_70._M_node + uVar15;
      local_70._M_first = *local_70._M_node;
      local_70._M_last = local_70._M_first + 0x40;
      pptVar11 = local_70._M_first + uVar8 + uVar15 * -0x40;
    }
    else {
      if (0x3f < uVar8) {
        uVar15 = uVar8 >> 6;
        goto LAB_002808ee;
      }
      pptVar11 = pptVar11 + local_d8;
    }
    i = &local_70;
    goto LAB_0028091e;
  }
  pptVar11 = (this->m_peers).
             super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             .
             super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_50._M_first =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_50._M_last =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_50._M_node =
       (this->m_peers).
       super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       .
       super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  uVar8 = ((long)pptVar11 - (long)local_50._M_first >> 3) + (ulong)uVar19;
  if ((long)uVar8 < 0) {
    uVar15 = (long)uVar8 >> 6;
LAB_002808a3:
    local_50._M_node = local_50._M_node + uVar15;
    local_50._M_first = *local_50._M_node;
    local_50._M_last = local_50._M_first + 0x40;
    pptVar11 = local_50._M_first + uVar8 + uVar15 * -0x40;
  }
  else {
    if (0x3f < uVar8) {
      uVar15 = uVar8 >> 6;
      goto LAB_002808a3;
    }
    pptVar11 = pptVar11 + uVar19;
  }
  i = &local_50;
LAB_0028091e:
  i->_M_cur = pptVar11;
  erase_peer(this,i,state);
  return;
}

Assistant:

void peer_list::erase_peers(torrent_state* state, erase_peer_flags_t const flags)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		int max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size == 0 || m_peers.empty()) return;

		int erase_candidate = -1;
		int force_erase_candidate = -1;

		if (bool(m_finished) != state->is_finished)
			recalculate_connect_candidates(state);

		int round_robin = aux::numeric_cast<int>(random(std::uint32_t(m_peers.size() - 1)));

		int low_watermark = max_peerlist_size * 95 / 100;
		if (low_watermark == max_peerlist_size) --low_watermark;

		for (int iterations = std::min(int(m_peers.size()), 300);
			iterations > 0; --iterations)
		{
			if (int(m_peers.size()) < low_watermark)
				break;

			if (round_robin == int(m_peers.size())) round_robin = 0;

			torrent_peer& pe = *m_peers[round_robin];
			TORRENT_ASSERT(pe.in_use);
			int const current = round_robin;

			if (is_erase_candidate(pe)
				&& (erase_candidate == -1
					|| !compare_peer_erase(*m_peers[erase_candidate], pe)))
			{
				if (should_erase_immediately(pe))
				{
					if (erase_candidate > current) --erase_candidate;
					if (force_erase_candidate > current) --force_erase_candidate;
					TORRENT_ASSERT(current >= 0 && current < int(m_peers.size()));
					erase_peer(m_peers.begin() + current, state);
					continue;
				}
				else
				{
					erase_candidate = current;
				}
			}
			if (is_force_erase_candidate(pe)
				&& (force_erase_candidate == -1
					|| !compare_peer_erase(*m_peers[force_erase_candidate], pe)))
			{
				force_erase_candidate = current;
			}

			++round_robin;
		}

		if (erase_candidate > -1)
		{
			TORRENT_ASSERT(erase_candidate >= 0 && erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + erase_candidate, state);
		}
		else if ((flags & force_erase) && force_erase_candidate > -1)
		{
			TORRENT_ASSERT(force_erase_candidate >= 0 && force_erase_candidate < int(m_peers.size()));
			erase_peer(m_peers.begin() + force_erase_candidate, state);
		}
	}